

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O1

vector<short,_std::allocator<short>_> *
utility::random_vector<short>
          (vector<short,_std::allocator<short>_> *__return_storage_ptr__,size_t size,short min,
          short max)

{
  pointer puVar1;
  result_type_conflict1 rVar2;
  long lVar3;
  long lVar4;
  uniform_int_distribution<short> uniform;
  default_random_engine generator;
  allocator_type local_3d;
  uniform_int_distribution<short> local_3c;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,size,&local_3d);
  local_38._M_x = 1;
  puVar1 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar4 != 0) {
    lVar3 = 0;
    local_3c._M_param._M_a = min;
    local_3c._M_param._M_b = max;
    do {
      rVar2 = std::uniform_int_distribution<short>::operator()
                        (&local_3c,&local_38,&local_3c._M_param);
      *(result_type_conflict1 *)(puVar1 + lVar3 * 2) = rVar2;
      lVar3 = lVar3 + 1;
    } while (lVar4 >> 1 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }